

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::ProductionSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::ProductionSyntax> *args)

{
  SyntaxList<slang::syntax::ProductionSyntax> *this_00;
  SyntaxList<slang::syntax::ProductionSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SyntaxList<slang::syntax::ProductionSyntax> *)allocate(this,0x30,8);
  slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>::SyntaxList(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }